

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O1

mg_map * mg_map_copy_ca(mg_map *map,mg_allocator *allocator)

{
  uint32_t uVar1;
  long lVar2;
  mg_map *buf;
  mg_string *pmVar3;
  mg_value *pmVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  
  if (map == (mg_map *)0x0) {
    return (mg_map *)0x0;
  }
  uVar6 = map->size;
  buf = (mg_map *)mg_allocator_malloc(allocator,(ulong)uVar6 * 0x10 + 0x18);
  if (buf == (mg_map *)0x0) {
    buf = (mg_map *)0x0;
  }
  else {
    buf->keys = (mg_string **)(buf + 1);
    buf->values = (mg_value **)(&buf[1].size + (ulong)uVar6 * 2);
  }
  uVar6 = 0;
  if (buf == (mg_map *)0x0) {
    return (mg_map *)0x0;
  }
  uVar1 = map->size;
  buf->capacity = uVar1;
  buf->size = uVar1;
  bVar10 = map->size != 0;
  if (bVar10) {
    pmVar3 = mg_string_copy_ca(*map->keys,allocator);
    *buf->keys = pmVar3;
    if (*buf->keys != (mg_string *)0x0) {
      lVar7 = 0;
      do {
        pmVar4 = mg_value_copy_ca(map->values[lVar7],allocator);
        buf->values[lVar7] = pmVar4;
        uVar8 = (uint)lVar7;
        uVar6 = uVar8;
        if (buf->values[lVar7] == (mg_value *)0x0) goto LAB_00109dbf;
        bVar10 = (uint)(lVar7 + 1) < map->size;
        if (!bVar10) break;
        pmVar3 = mg_string_copy_ca(map->keys[lVar7 + 1],allocator);
        buf->keys[lVar7 + 1] = pmVar3;
        lVar2 = lVar7 + 1;
        lVar7 = lVar7 + 1;
      } while (buf->keys[lVar2] != (mg_string *)0x0);
      uVar6 = uVar8 + 1;
LAB_00109dbf:
      uVar9 = (ulong)(uVar8 + 1);
      goto LAB_00109dc2;
    }
  }
  uVar9 = 0;
LAB_00109dc2:
  if (bVar10) {
    if ((int)uVar9 != 0) {
      uVar5 = 0;
      do {
        if (map->keys[uVar5] != (mg_string *)0x0) {
          mg_allocator_free(&mg_system_allocator,map->keys[uVar5]);
        }
        uVar5 = uVar5 + 1;
      } while (uVar9 != uVar5);
    }
    if (uVar6 != 0) {
      uVar9 = 0;
      do {
        if (map->values[uVar9] != (mg_value *)0x0) {
          mg_value_destroy_ca(map->values[uVar9],&mg_system_allocator);
        }
        uVar9 = uVar9 + 1;
      } while (uVar6 != uVar9);
    }
    mg_allocator_free(&mg_system_allocator,buf);
    return (mg_map *)0x0;
  }
  return buf;
}

Assistant:

mg_map *mg_map_copy_ca(const mg_map *map, mg_allocator *allocator) {
  if (!map) {
    return NULL;
  }
  mg_map *nmap = mg_map_alloc(map->size, allocator);
  if (!nmap) {
    return NULL;
  }
  nmap->capacity = map->size;
  nmap->size = map->size;
  uint32_t keys_copied = 0;
  uint32_t values_copied = 0;
  for (uint32_t i = 0; i < map->size; ++i) {
    nmap->keys[i] = mg_string_copy_ca(map->keys[i], allocator);
    if (!nmap->keys[i]) {
      goto cleanup;
    }
    keys_copied++;
    nmap->values[i] = mg_value_copy_ca(map->values[i], allocator);
    if (!nmap->values[i]) {
      goto cleanup;
    }
    values_copied++;
  }
  return nmap;

cleanup:
  for (uint32_t i = 0; i < keys_copied; ++i) {
    mg_string_destroy(map->keys[i]);
  }
  for (uint32_t i = 0; i < values_copied; ++i) {
    mg_value_destroy(map->values[i]);
  }
  mg_allocator_free(&mg_system_allocator, nmap);
  return NULL;
}